

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_verifier.cpp
# Opt level: O3

bool __thiscall
duckdb::PreparedStatementVerifier::Run
          (PreparedStatementVerifier *this,ClientContext *context,string *query,
          function<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>)>
          *run)

{
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer pQVar5;
  pointer *__ptr;
  ErrorData error;
  undefined1 local_e8 [8];
  undefined1 local_e0 [16];
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_d0;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_c8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *local_c0;
  undefined1 local_b8 [8];
  string local_b0 [4];
  
  Extract(this);
  paVar2 = &local_b0[0].field_2;
  local_b0[0]._M_string_length = 0;
  local_b0[0].field_2._M_local_buf[0] = '\0';
  local_c8._M_head_impl =
       (this->prepare_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (this->prepare_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  local_c0 = (this->super_StatementVerifier).parameters.ptr;
  local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
  if ((run->super__Function_base)._M_manager == (_Manager_type)0x0) {
    ::std::__throw_bad_function_call();
  }
  (*run->_M_invoker)((_Any_data *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)run,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)(local_b8 + 8),
                     (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                      *)&local_c8);
  if (local_c8._M_head_impl != (SQLStatement *)0x0) {
    (*(local_c8._M_head_impl)->_vptr_SQLStatement[1])();
  }
  local_c8._M_head_impl = (SQLStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0[0]._M_dataplus._M_p);
  }
  pQVar5 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)local_e8);
  bVar4 = BaseQueryResult::HasError(&pQVar5->super_BaseQueryResult);
  if (bVar4) {
    pQVar5 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                         *)local_e8);
    local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_b8 + 8),"Failed prepare during verify: ","");
    BaseQueryResult::ThrowError(&pQVar5->super_BaseQueryResult,(string *)(local_b8 + 8));
  }
  local_b0[0]._M_string_length = 0;
  local_b0[0].field_2._M_local_buf[0] = '\0';
  local_d0._M_head_impl =
       (this->execute_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (this->execute_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  local_c0 = (this->super_StatementVerifier).parameters.ptr;
  if ((run->super__Function_base)._M_manager == (_Manager_type)0x0) {
    local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
    ::std::__throw_bad_function_call();
  }
  local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
  (*run->_M_invoker)((_Any_data *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)run,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)(local_b8 + 8),
                     (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                      *)&local_d0);
  if (local_d0._M_head_impl != (SQLStatement *)0x0) {
    (*(local_d0._M_head_impl)->_vptr_SQLStatement[1])();
  }
  local_d0._M_head_impl = (SQLStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0[0]._M_dataplus._M_p);
  }
  pQVar5 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)local_e0);
  bVar4 = BaseQueryResult::HasError(&pQVar5->super_BaseQueryResult);
  uVar3 = local_e0._0_8_;
  if (!bVar4) {
    local_e0._0_8_ = (long *)0x0;
    _Var1._M_head_impl =
         (this->super_StatementVerifier).materialized_result.
         super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
         .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl;
    (this->super_StatementVerifier).materialized_result.
    super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
    .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
         (MaterializedQueryResult *)uVar3;
    if (_Var1._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_QueryResult + 8))();
      if ((long *)local_e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_e0._0_8_ + 8))();
      }
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    local_b0[0]._M_string_length = 0;
    local_b0[0].field_2._M_local_buf[0] = '\0';
    local_e0._8_8_ =
         (this->dealloc_statement).
         super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (this->dealloc_statement).
    super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    local_e8 = (undefined1  [8])(this->super_StatementVerifier).parameters.ptr;
    if ((run->super__Function_base)._M_manager != (_Manager_type)0x0) {
      local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
      (*run->_M_invoker)((_Any_data *)local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)run,
                         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                          *)(local_b8 + 8),
                         (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                          *)(local_e0 + 8));
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
      local_b8 = (undefined1  [8])0x0;
      if ((SQLStatement *)local_e0._8_8_ != (SQLStatement *)0x0) {
        (**(code **)(*(long *)local_e0._8_8_ + 8))();
      }
      local_e0._8_8_ = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0[0]._M_dataplus._M_p);
      }
      LOCK();
      (context->interrupted)._M_base._M_i = false;
      UNLOCK();
      return false;
    }
    local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
    ::std::__throw_bad_function_call();
  }
  pQVar5 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)local_e0);
  local_b0[0]._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_b8 + 8),"Failed execute during verify: ","");
  BaseQueryResult::ThrowError(&pQVar5->super_BaseQueryResult,(string *)(local_b8 + 8));
}

Assistant:

bool PreparedStatementVerifier::Run(
    ClientContext &context, const string &query,
    const std::function<unique_ptr<QueryResult>(const string &, unique_ptr<SQLStatement>,
                                                optional_ptr<case_insensitive_map_t<BoundParameterData>>)> &run) {
	bool failed = false;
	// verify that we can extract all constants from the query and run the query as a prepared statement
	// create the PREPARE and EXECUTE statements
	Extract();
	// execute the prepared statements
	try {
		auto prepare_result = run(string(), std::move(prepare_statement), parameters);
		if (prepare_result->HasError()) {
			prepare_result->ThrowError("Failed prepare during verify: ");
		}
		auto execute_result = run(string(), std::move(execute_statement), parameters);
		if (execute_result->HasError()) {
			execute_result->ThrowError("Failed execute during verify: ");
		}
		materialized_result = unique_ptr_cast<QueryResult, MaterializedQueryResult>(std::move(execute_result));
	} catch (const std::exception &ex) {
		ErrorData error(ex);
		if (error.Type() != ExceptionType::PARAMETER_NOT_ALLOWED) {
			materialized_result = make_uniq<MaterializedQueryResult>(std::move(error));
		}
		failed = true;
	}
	run(string(), std::move(dealloc_statement), parameters);
	context.interrupted = false;

	return failed;
}